

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall
QXmlStreamPrivateTagStack::QXmlStreamPrivateTagStack(QXmlStreamPrivateTagStack *this)

{
  NamespaceDeclaration *pNVar1;
  long in_FS_OFFSET;
  QAnyStringView s;
  QAnyStringView s_00;
  XmlStringRef local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->namespaceDeclarations).data = (NamespaceDeclaration *)0x0;
  (this->namespaceDeclarations).tos = -1;
  (this->tagStack).data = (Tag *)0x0;
  (this->namespaceDeclarations).cap = 0;
  (this->tagStackStringStorage).d.d = (Data *)0x0;
  (this->tagStackStringStorage).d.ptr = (char16_t *)0x0;
  (this->tagStackStringStorage).d.size = 0;
  (this->tagStack).tos = -1;
  (this->tagStack).cap = 0;
  QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::Tag>::reserve(&this->tagStack,0x10);
  QString::reserve(&this->tagStackStringStorage,0x20);
  this->tagStackStringStorageSize = 0;
  pNVar1 = QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::push
                     (&this->namespaceDeclarations);
  s.m_size = 0x8000000000000003;
  s.field_0.m_data_utf16 = L"xml";
  addToStringStorage(&local_40,this,s);
  (pNVar1->prefix).m_size = local_40.m_size;
  (pNVar1->prefix).m_string = (QString *)CONCAT44(local_40.m_string._4_4_,local_40.m_string._0_4_);
  (pNVar1->prefix).m_pos = CONCAT44(local_40.m_pos._4_4_,(undefined4)local_40.m_pos);
  s_00.m_size = 0x8000000000000024;
  s_00.field_0.m_data_utf16 = L"http://www.w3.org/XML/1998/namespace";
  addToStringStorage(&local_40,this,s_00);
  (pNVar1->namespaceUri).m_size = local_40.m_size;
  *(undefined4 *)&(pNVar1->namespaceUri).m_string = local_40.m_string._0_4_;
  *(undefined4 *)((long)&(pNVar1->namespaceUri).m_string + 4) = local_40.m_string._4_4_;
  *(undefined4 *)&(pNVar1->namespaceUri).m_pos = (undefined4)local_40.m_pos;
  *(undefined4 *)((long)&(pNVar1->namespaceUri).m_pos + 4) = local_40.m_pos._4_4_;
  this->initialTagStackStringStorageSize = this->tagStackStringStorageSize;
  this->tagsDone = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QXmlStreamPrivateTagStack::QXmlStreamPrivateTagStack()
{
    tagStack.reserve(16);
    tagStackStringStorage.reserve(32);
    tagStackStringStorageSize = 0;
    NamespaceDeclaration &namespaceDeclaration = namespaceDeclarations.push();
    namespaceDeclaration.prefix = addToStringStorage(u"xml");
    namespaceDeclaration.namespaceUri = addToStringStorage(u"http://www.w3.org/XML/1998/namespace");
    initialTagStackStringStorageSize = tagStackStringStorageSize;
    tagsDone = false;
}